

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.hpp
# Opt level: O3

Span * __thiscall tcmalloc::PageHeap::Carve(PageHeap *this,Span *span,uint64_t n)

{
  PageMap *this_00;
  uint64_t *puVar1;
  ulong uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  bool bVar5;
  Span *span_00;
  uint64_t uVar6;
  
  uVar2 = span->npages;
  uVar3 = span->location;
  span->location = 0;
  uVar6 = uVar2 - n;
  if (uVar2 < n || uVar6 == 0) {
    puVar1 = &(this->stat).in_used_bytes;
    *puVar1 = *puVar1 + uVar2 * 0x2000;
  }
  else {
    uVar4 = span->page_id;
    span_00 = FixedAllocator<tcmalloc::Span>::Alloc
                        ((FixedAllocator<tcmalloc::Span> *)span_allocator);
    span_00->prev = (Span *)0x0;
    span_00->page_id = uVar4 + n;
    span_00->npages = uVar6;
    span_00->refcount = 0;
    span->npages = n;
    this_00 = &this->page_map_;
    bVar5 = PageMap::Set(this_00,(span->page_id + n) - 1,span);
    if (!bVar5) {
      __assert_fail("page_map_.Set(span->page_id + n - 1, span)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                    ,0xf6,"Span *tcmalloc::PageHeap::Carve(Span *, uint64_t)");
    }
    bVar5 = PageMap::Set(this_00,span_00->page_id,span_00);
    if (!bVar5) {
      __assert_fail("page_map_.Set(new_span->page_id, new_span)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                    ,0xf7,"Span *tcmalloc::PageHeap::Carve(Span *, uint64_t)");
    }
    bVar5 = PageMap::Set(this_00,(span_00->page_id + uVar6) - 1,span_00);
    if (!bVar5) {
      __assert_fail("page_map_.Set(new_span->page_id + extra -1, new_span)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                    ,0xf8,"Span *tcmalloc::PageHeap::Carve(Span *, uint64_t)");
    }
    span_00->location = uVar3;
    InsertToFreeList(this,span_00);
    puVar1 = &(this->stat).in_used_bytes;
    *puVar1 = *puVar1 + span->npages * 0x2000;
    bVar5 = CheckSmallList(this);
    if (!bVar5) {
      __assert_fail("CheckSmallList()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                    ,0xfd,"Span *tcmalloc::PageHeap::Carve(Span *, uint64_t)");
    }
  }
  return span;
}

Assistant:

Span* Carve(Span* span, uint64_t n) {
        auto old_location = span->location;
        span->location = Span::IN_USE;
        if (span->npages <= n) {
            stat.in_used_bytes += span->npages * spanPageSize;
            return span;
        }

        uint64_t extra = span->npages - n;
        Span* new_span = NewSpan(span->page_id + n, extra);

        span->npages = n;
        // oom
        assert(new_span != nullptr);
        assert(page_map_.Set(span->page_id + n - 1, span));
        assert(page_map_.Set(new_span->page_id, new_span));
        assert(page_map_.Set(new_span->page_id + extra -1, new_span));

        new_span->location = old_location;
        InsertToFreeList(new_span);
        stat.in_used_bytes += span->npages * spanPageSize;
        assert(CheckSmallList());
        return span;
    }